

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_ns_cert_type(uchar **p,uchar *end,uchar *ns_cert_type)

{
  int iVar1;
  undefined1 auStack_28 [8];
  mbedtls_x509_bitstring bs;
  
  auStack_28 = (undefined1  [8])0x0;
  bs.len = 0;
  bs.unused_bits = '\0';
  bs._9_7_ = 0;
  iVar1 = mbedtls_asn1_get_bitstring(p,end,(mbedtls_asn1_bitstring *)auStack_28);
  if (iVar1 == 0) {
    if (auStack_28 == (undefined1  [8])0x1) {
      *ns_cert_type = *(uchar *)bs._8_8_;
    }
    else {
      if (auStack_28 != (undefined1  [8])0x0) {
        return -0x2564;
      }
      *ns_cert_type = '\0';
    }
    iVar1 = 0;
  }
  else {
    iVar1 = iVar1 + -0x2500;
  }
  return iVar1;
}

Assistant:

int mbedtls_x509_get_ns_cert_type(unsigned char **p,
                                  const unsigned char *end,
                                  unsigned char *ns_cert_type)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_x509_bitstring bs = { 0, 0, NULL };

    if ((ret = mbedtls_asn1_get_bitstring(p, end, &bs)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    /* A bitstring with no flags set is still technically valid, as it will mean
       that the certificate has no designated purpose at the time of creation. */
    if (bs.len == 0) {
        *ns_cert_type = 0;
        return 0;
    }

    if (bs.len != 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_INVALID_LENGTH);
    }

    /* Get actual bitstring */
    *ns_cert_type = *bs.p;
    return 0;
}